

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O2

void __thiscall IntegerCompressor::initCompressor(IntegerCompressor *this)

{
  ArithmeticModel **ppAVar1;
  ArithmeticModel *pAVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->enc != (ArithmeticEncoder *)0x0) {
    if (this->mBits == (ArithmeticModel **)0x0) {
      uVar3 = (ulong)this->contexts;
      ppAVar1 = (ArithmeticModel **)operator_new__(uVar3 << 3);
      this->mBits = ppAVar1;
      for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
        pAVar2 = ArithmeticEncoder::createSymbolModel(this->enc,this->corr_bits + 1);
        this->mBits[uVar5] = pAVar2;
        uVar3 = (ulong)this->contexts;
      }
      ppAVar1 = (ArithmeticModel **)operator_new__((ulong)(this->corr_bits + 1) << 3);
      this->mCorrector = ppAVar1;
      pAVar2 = (ArithmeticModel *)ArithmeticEncoder::createBitModel(this->enc);
      *this->mCorrector = pAVar2;
      uVar5 = 1;
      while (uVar4 = (uint)uVar5, uVar4 <= this->corr_bits) {
        uVar3 = (ulong)this->bits_high;
        if (uVar4 < this->bits_high) {
          uVar3 = uVar5;
        }
        pAVar2 = ArithmeticEncoder::createSymbolModel(this->enc,1 << ((byte)uVar3 & 0x1f));
        this->mCorrector[uVar5] = pAVar2;
        uVar5 = (ulong)(uVar4 + 1);
      }
    }
    uVar4 = 1;
    for (uVar5 = 0; uVar5 < this->contexts; uVar5 = uVar5 + 1) {
      ArithmeticEncoder::initSymbolModel(this->enc,this->mBits[uVar5],(U32 *)0x0);
    }
    ArithmeticEncoder::initBitModel(this->enc,(ArithmeticBitModel *)*this->mCorrector);
    for (; uVar4 <= this->corr_bits; uVar4 = uVar4 + 1) {
      ArithmeticEncoder::initSymbolModel(this->enc,this->mCorrector[uVar4],(U32 *)0x0);
    }
    return;
  }
  __assert_fail("enc",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                ,0xdf,"void IntegerCompressor::initCompressor()");
}

Assistant:

void IntegerCompressor::initCompressor()
{
  U32 i;

  assert(enc);

  // maybe create the models
  if (mBits == 0)
  {
    mBits = new ArithmeticModel*[contexts];
    for (i = 0; i < contexts; i++)
    {
      mBits[i] = enc->createSymbolModel(corr_bits+1);
    }
#ifndef COMPRESS_ONLY_K
    mCorrector = new ArithmeticModel*[corr_bits+1];
    mCorrector[0] = (ArithmeticModel*)enc->createBitModel();
    for (i = 1; i <= corr_bits; i++)
    {
      if (i <= bits_high)
      {
        mCorrector[i] = enc->createSymbolModel(1<<i);
      }
      else
      {
        mCorrector[i] = enc->createSymbolModel(1<<bits_high);
      }
    }
#endif
  }

  // certainly init the models
  for (i = 0; i < contexts; i++)
  {
    enc->initSymbolModel(mBits[i]);
  }
#ifndef COMPRESS_ONLY_K
  enc->initBitModel((ArithmeticBitModel*)mCorrector[0]);
  for (i = 1; i <= corr_bits; i++)
  {
    enc->initSymbolModel(mCorrector[i]);
  }
#endif
}